

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ringbuf.c
# Opt level: O2

adt_buf_err_t adt_rbfh_remove(adt_rbfh_t *self,uint8_t *u8Data)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  
  if (self->u16NumElem != 0) {
    uVar2 = self->u16AllocLen;
    bVar1 = self->u8ElemSize;
    puVar3 = self->u8AllocBuf;
    memcpy(u8Data,self->u8ReadPtr,(ulong)bVar1);
    puVar4 = self->u8ReadPtr;
    self->u8ReadPtr = puVar4 + self->u8ElemSize;
    if (puVar4 + self->u8ElemSize == puVar3 + (ulong)uVar2 * (ulong)bVar1) {
      self->u8ReadPtr = self->u8AllocBuf;
    }
    self->u16NumElem = self->u16NumElem - 1;
    return '\0';
  }
  return '\x03';
}

Assistant:

adt_buf_err_t adt_rbfh_remove(adt_rbfh_t* self, uint8_t* u8Data)
{
   uint8_t* u8EndPtr = self->u8AllocBuf + (self->u16AllocLen * ((uint32_t)self->u8ElemSize));

   if (self->u16NumElem == 0)
   {
      return BUF_E_UNDERFLOW;
   }
   memcpy(u8Data, self->u8ReadPtr, (size_t) self->u8ElemSize);
   self->u8ReadPtr+=self->u8ElemSize;
   if (self->u8ReadPtr == u8EndPtr)
   {
      self->u8ReadPtr = self->u8AllocBuf;
   }
   self->u16NumElem--;
   return BUF_E_OK;
}